

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,char *zone_title)

{
  REF_GATHER pRVar1;
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_GEOM pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  int iVar5;
  FILE *pFVar6;
  void *__ptr;
  long lVar7;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  REF_DBL local_188;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT ref_malloc_init_i;
  REF_INT *hits;
  double dStack_140;
  REF_INT i;
  REF_DBL area;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL metric_area;
  REF_INT ldim;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  int local_f8;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_DBL quality;
  REF_DBL dot;
  REF_DBL *scalar;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_INT local_b8;
  REF_INT node;
  REF_INT nodes [27];
  int local_44;
  REF_INT cell_node;
  REF_INT cell;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GATHER ref_gather;
  char *zone_title_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->gather;
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  pRVar2 = ref_grid->geom;
  ref_private_macro_code_rss = 4;
  ref_private_macro_code_rss_1 = 0;
  if (pRVar1->recording == 0) {
    ref_grid_local._4_4_ = 0;
  }
  else {
    ref_private_macro_code_rss_2 = ref_gather_tec_histogram_frame(ref_grid,zone_title);
    if (ref_private_macro_code_rss_2 == 0) {
      ref_private_macro_code_rss_3 = ref_node_synchronize_globals(ref_node_00);
      if (ref_private_macro_code_rss_3 == 0) {
        ref_private_macro_code_rss_4 =
             ref_grid_compact_cell_nodes
                       (ref_grid,ref_cell_00,(REF_GLOB *)&l2c,(REF_LONG *)&scalar,
                        (REF_GLOB **)&ncell);
        if (ref_private_macro_code_rss_4 == 0) {
          if (ref_grid->mpi->id == 0) {
            if (pRVar1->grid_file == (FILE *)0x0) {
              pFVar6 = fopen("ref_gather_movie.tec","w");
              pRVar1->grid_file = (FILE *)pFVar6;
              if (pRVar1->grid_file == (FILE *)0x0) {
                printf("unable to open ref_gather_movie.tec\n");
              }
              if (pRVar1->grid_file == (FILE *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x37f,"ref_gather_tec_movie_frame","unable to open file");
                return 2;
              }
              fprintf((FILE *)pRVar1->grid_file,"title=\"tecplot refine partition file\"\n");
              fprintf((FILE *)pRVar1->grid_file,
                      "variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n");
            }
            if (zone_title == (char *)0x0) {
              fprintf((FILE *)pRVar1->grid_file,
                      "zone t=\"surf\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                      ,pRVar1->time,l2c,scalar,"point","fetriangle");
            }
            else {
              fprintf((FILE *)pRVar1->grid_file,
                      "zone t=\"%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                      ,pRVar1->time,zone_title,l2c,scalar,"point","fetriangle");
            }
          }
          if (ref_private_macro_code_rss * ref_node_00->max < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x396,"ref_gather_tec_movie_frame","malloc scalar of REF_DBL negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            dot = (REF_DBL)malloc((long)(ref_private_macro_code_rss * ref_node_00->max) << 3);
            if ((void *)dot == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x396,"ref_gather_tec_movie_frame","malloc scalar of REF_DBL NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (nnode._4_4_ = 0; nnode._4_4_ < ref_node_00->max; nnode._4_4_ = nnode._4_4_ + 1) {
                if (((-1 < nnode._4_4_) && (nnode._4_4_ < ref_node_00->max)) &&
                   (-1 < ref_node_00->global[nnode._4_4_])) {
                  *(undefined8 *)((long)dot + (long)(ref_private_macro_code_rss * nnode._4_4_) * 8)
                       = 0x4000000000000000;
                  *(undefined8 *)
                   ((long)dot + (long)(ref_private_macro_code_rss * nnode._4_4_ + 1) * 8) =
                       0x3ff0000000000000;
                  *(undefined8 *)
                   ((long)dot + (long)(ref_private_macro_code_rss * nnode._4_4_ + 2) * 8) =
                       0x3ff0000000000000;
                  *(double *)((long)dot + (long)(ref_private_macro_code_rss * nnode._4_4_ + 3) * 8)
                       = (double)ref_node_00->part[nnode._4_4_];
                }
              }
              if ((pRVar2->model != (void *)0x0) || (ref_grid->twod != 0)) {
                if ((pRVar2->model != (void *)0x0) || (pRVar2->meshlink != (void *)0x0)) {
                  for (local_44 = 0; local_44 < ref_cell_00->max; local_44 = local_44 + 1) {
                    RVar3 = ref_cell_nodes(ref_cell_00,local_44,&local_b8);
                    if (RVar3 == 0) {
                      ref_private_macro_code_rss_5 =
                           ref_geom_tri_norm_deviation(ref_grid,&local_b8,&quality);
                      if (ref_private_macro_code_rss_5 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x3a0,"ref_gather_tec_movie_frame",
                               (ulong)(uint)ref_private_macro_code_rss_5,"norm dev");
                        return ref_private_macro_code_rss_5;
                      }
                      for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->node_per;
                          nodes[0x1a] = nodes[0x1a] + 1) {
                        if (quality <=
                            *(double *)
                             ((long)dot +
                             (long)(ref_private_macro_code_rss * (&local_b8)[nodes[0x1a]]) * 8)) {
                          local_188 = quality;
                        }
                        else {
                          local_188 = *(REF_DBL *)
                                       ((long)dot +
                                       (long)(ref_private_macro_code_rss * (&local_b8)[nodes[0x1a]])
                                       * 8);
                        }
                        *(REF_DBL *)
                         ((long)dot +
                         (long)(ref_private_macro_code_rss * (&local_b8)[nodes[0x1a]]) * 8) =
                             local_188;
                      }
                      ref_private_macro_code_rss_5 = 0;
                    }
                  }
                }
                if (ref_grid->twod != 0) {
                  for (local_44 = 0; local_44 < ref_cell_00->max; local_44 = local_44 + 1) {
                    RVar3 = ref_cell_nodes(ref_cell_00,local_44,&local_b8);
                    if (RVar3 == 0) {
                      ref_private_macro_code_rss_6 =
                           ref_node_tri_quality(ref_node_00,&local_b8,(REF_DBL *)&node0);
                      if (ref_private_macro_code_rss_6 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x3a9,"ref_gather_tec_movie_frame",
                               (ulong)(uint)ref_private_macro_code_rss_6,"tri qual");
                        return ref_private_macro_code_rss_6;
                      }
                      for (nodes[0x1a] = 0; nodes[0x1a] < ref_cell_00->node_per;
                          nodes[0x1a] = nodes[0x1a] + 1) {
                        if (_node0 <= *(double *)
                                       ((long)dot +
                                       (long)(ref_private_macro_code_rss * (&local_b8)[nodes[0x1a]])
                                       * 8)) {
                          local_190 = _node0;
                        }
                        else {
                          local_190 = *(double *)
                                       ((long)dot +
                                       (long)(ref_private_macro_code_rss * (&local_b8)[nodes[0x1a]])
                                       * 8);
                        }
                        *(double *)
                         ((long)dot +
                         (long)(ref_private_macro_code_rss * (&local_b8)[nodes[0x1a]]) * 8) =
                             local_190;
                      }
                      ref_private_macro_code_rss_6 = 0;
                    }
                  }
                }
                ref_private_macro_code_rss_7 = ref_edge_create((REF_EDGE *)&edge_ratio,ref_grid);
                if (ref_private_macro_code_rss_7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x3b0,"ref_gather_tec_movie_frame",
                         (ulong)(uint)ref_private_macro_code_rss_7,"create edges");
                  return ref_private_macro_code_rss_7;
                }
                ref_private_macro_code_rss_7 = 0;
                for (node1 = 0; node1 < *(int *)edge_ratio; node1 = node1 + 1) {
                  local_f8 = *(REF_INT *)(*(long *)((long)edge_ratio + 8) + (long)(node1 << 1) * 4);
                  ref_edge._4_4_ =
                       *(REF_INT *)(*(long *)((long)edge_ratio + 8) + (long)(node1 * 2 + 1) * 4);
                  area._4_4_ = ref_node_ratio(ref_node_00,local_f8,ref_edge._4_4_,
                                              (REF_DBL *)&metric_area);
                  if (area._4_4_ != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                           ,0x3b4,"ref_gather_tec_movie_frame",(ulong)area._4_4_,"ratio");
                    return area._4_4_;
                  }
                  if (_metric_area <=
                      *(double *)((long)dot + (long)(ref_private_macro_code_rss * local_f8 + 1) * 8)
                     ) {
                    local_198 = _metric_area;
                  }
                  else {
                    local_198 = *(double *)
                                 ((long)dot + (long)(ref_private_macro_code_rss * local_f8 + 1) * 8)
                    ;
                  }
                  *(double *)((long)dot + (long)(ref_private_macro_code_rss * local_f8 + 1) * 8) =
                       local_198;
                  if (_metric_area <=
                      *(double *)
                       ((long)dot + (long)(ref_private_macro_code_rss * ref_edge._4_4_ + 1) * 8)) {
                    local_1a0 = _metric_area;
                  }
                  else {
                    local_1a0 = *(double *)
                                 ((long)dot +
                                 (long)(ref_private_macro_code_rss * ref_edge._4_4_ + 1) * 8);
                  }
                  *(double *)
                   ((long)dot + (long)(ref_private_macro_code_rss * ref_edge._4_4_ + 1) * 8) =
                       local_1a0;
                  if (*(double *)((long)dot + (long)(ref_private_macro_code_rss * local_f8 + 2) * 8)
                      <= _metric_area) {
                    local_1a8 = _metric_area;
                  }
                  else {
                    local_1a8 = *(double *)
                                 ((long)dot + (long)(ref_private_macro_code_rss * local_f8 + 2) * 8)
                    ;
                  }
                  *(double *)((long)dot + (long)(ref_private_macro_code_rss * local_f8 + 2) * 8) =
                       local_1a8;
                  if (*(double *)
                       ((long)dot + (long)(ref_private_macro_code_rss * ref_edge._4_4_ + 2) * 8) <=
                      _metric_area) {
                    local_1b0 = _metric_area;
                  }
                  else {
                    local_1b0 = *(double *)
                                 ((long)dot +
                                 (long)(ref_private_macro_code_rss * ref_edge._4_4_ + 2) * 8);
                  }
                  *(double *)
                   ((long)dot + (long)(ref_private_macro_code_rss * ref_edge._4_4_ + 2) * 8) =
                       local_1b0;
                  area._4_4_ = 0;
                }
                area._0_4_ = ref_edge_free((REF_EDGE)edge_ratio);
                if (area._0_4_ != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x3ba,"ref_gather_tec_movie_frame",(ulong)area._0_4_,"free edges");
                  return area._0_4_;
                }
                area._0_4_ = 0;
              }
              if ((ref_private_macro_code_rss_1 != 0) && (ref_grid->twod != 0)) {
                if (ref_node_00->max < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x3c0,"ref_gather_tec_movie_frame","malloc hits of REF_INT negative");
                  return 1;
                }
                __ptr = malloc((long)ref_node_00->max << 2);
                if (__ptr == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x3c0,"ref_gather_tec_movie_frame","malloc hits of REF_INT NULL");
                  return 2;
                }
                for (ref_private_macro_code_rss_9 = 0;
                    ref_private_macro_code_rss_9 < ref_node_00->max;
                    ref_private_macro_code_rss_9 = ref_private_macro_code_rss_9 + 1) {
                  *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_9 * 4) = 0;
                }
                for (nnode._4_4_ = 0; nnode._4_4_ < ref_node_00->max; nnode._4_4_ = nnode._4_4_ + 1)
                {
                  if (((-1 < nnode._4_4_) && (nnode._4_4_ < ref_node_00->max)) &&
                     (-1 < ref_node_00->global[nnode._4_4_])) {
                    *(undefined8 *)
                     ((long)dot + (long)(ref_private_macro_code_rss * nnode._4_4_ + 3) * 8) = 0;
                  }
                }
                for (local_44 = 0; local_44 < ref_cell_00->max; local_44 = local_44 + 1) {
                  RVar3 = ref_cell_nodes(ref_cell_00,local_44,&local_b8);
                  if (RVar3 == 0) {
                    uVar4 = ref_node_tri_metric_area(ref_node_00,&local_b8,&stack0xfffffffffffffec0)
                    ;
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x3c3,"ref_gather_tec_movie_frame",(ulong)uVar4,"tri area");
                      return uVar4;
                    }
                    for (hits._4_4_ = 0; hits._4_4_ < 3; hits._4_4_ = hits._4_4_ + 1) {
                      lVar7 = (long)(ref_private_macro_code_rss * (&local_b8)[hits._4_4_] + 3);
                      *(double *)((long)dot + lVar7 * 8) =
                           dStack_140 + *(double *)((long)dot + lVar7 * 8);
                      *(int *)((long)__ptr + (long)(&local_b8)[hits._4_4_] * 4) =
                           *(int *)((long)__ptr + (long)(&local_b8)[hits._4_4_] * 4) + 1;
                    }
                  }
                }
                for (nnode._4_4_ = 0; nnode._4_4_ < ref_node_00->max; nnode._4_4_ = nnode._4_4_ + 1)
                {
                  if (((-1 < nnode._4_4_) && (nnode._4_4_ < ref_node_00->max)) &&
                     ((-1 < ref_node_00->global[nnode._4_4_] &&
                      (0 < *(int *)((long)__ptr + (long)nnode._4_4_ * 4))))) {
                    lVar7 = (long)(ref_private_macro_code_rss * nnode._4_4_ + 3);
                    *(double *)((long)dot + lVar7 * 8) =
                         *(double *)((long)dot + lVar7 * 8) /
                         (double)*(int *)((long)__ptr + (long)nnode._4_4_ * 4);
                  }
                }
                if (__ptr != (void *)0x0) {
                  free(__ptr);
                }
              }
              ref_grid_local._4_4_ =
                   ref_gather_node_tec_part
                             (ref_node_00,(REF_GLOB)l2c,(REF_GLOB *)ncell,ref_private_macro_code_rss
                              ,(REF_DBL *)dot,pRVar1->grid_file);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ =
                     ref_gather_cell_tec(ref_node_00,ref_cell_00,(REF_LONG)scalar,(REF_GLOB *)ncell,
                                         0,pRVar1->grid_file);
                if (ref_grid_local._4_4_ == 0) {
                  if (ncell != 0) {
                    free((void *)ncell);
                  }
                  if (pRVar1->low_quality_zone != 0) {
                    uVar4 = ref_gather_cell_below_quality
                                      (ref_grid,ref_grid->cell[8],pRVar1->min_quality,
                                       (REF_GLOB *)&l2c,(REF_LONG *)&scalar,(REF_GLOB **)&ncell);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x3dd,"ref_gather_tec_movie_frame",(ulong)uVar4,"cell below");
                      return uVar4;
                    }
                    if ((0 < nnode._4_4_) && (0 < (long)scalar)) {
                      if (ref_grid->mpi->id == 0) {
                        if (zone_title == (char *)0x0) {
                          fprintf((FILE *)pRVar1->grid_file,
                                  "zone t=\"qtet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                                  ,pRVar1->time,l2c,scalar,"point","fetetrahedron");
                        }
                        else {
                          fprintf((FILE *)pRVar1->grid_file,
                                  "zone t=\"q%s\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s, solutiontime=%f\n"
                                  ,pRVar1->time,zone_title,l2c,scalar,"point","fetetrahedron");
                        }
                      }
                      uVar4 = ref_gather_node_tec_part
                                        (ref_node_00,(REF_GLOB)l2c,(REF_GLOB *)ncell,
                                         ref_private_macro_code_rss,(REF_DBL *)dot,pRVar1->grid_file
                                        );
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x3f2,"ref_gather_tec_movie_frame",(ulong)uVar4,"nodes");
                        return uVar4;
                      }
                      uVar4 = ref_gather_cell_quality_tec
                                        (ref_node_00,ref_grid->cell[8],(REF_LONG)scalar,
                                         (REF_GLOB *)ncell,pRVar1->min_quality,pRVar1->grid_file);
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                               ,0x3f6,"ref_gather_tec_movie_frame",(ulong)uVar4,"qtet");
                        return uVar4;
                      }
                    }
                    if (ncell != 0) {
                      free((void *)ncell);
                    }
                  }
                  if (ref_grid->mpi->id == 0) {
                    iVar5 = fflush((FILE *)pRVar1->grid_file);
                    if ((long)iVar5 != 0) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x3fc,"ref_gather_tec_movie_frame","gather movie fflush",0,(long)iVar5
                            );
                      return 1;
                    }
                    pRVar1->time = pRVar1->time + 1.0;
                  }
                  if (dot != 0.0) {
                    free((void *)dot);
                  }
                  ref_grid_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x3d6,"ref_gather_tec_movie_frame",(ulong)ref_grid_local._4_4_,"t");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,0x3d3,"ref_gather_tec_movie_frame",(ulong)ref_grid_local._4_4_,"nodes");
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x378,"ref_gather_tec_movie_frame",(ulong)(uint)ref_private_macro_code_rss_4,"l2c")
          ;
          ref_grid_local._4_4_ = ref_private_macro_code_rss_4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x375,"ref_gather_tec_movie_frame",(ulong)(uint)ref_private_macro_code_rss_3,"sync");
        ref_grid_local._4_4_ = ref_private_macro_code_rss_3;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x373,"ref_gather_tec_movie_frame",(ulong)(uint)ref_private_macro_code_rss_2,
             "hist frame");
      ref_grid_local._4_4_ = ref_private_macro_code_rss_2;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_tec_movie_frame(REF_GRID ref_grid,
                                              const char *zone_title) {
  REF_GATHER ref_gather = ref_grid_gather(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_DBL *scalar, dot, quality;
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_INT ldim = 4;
  REF_BOOL metric_area = REF_FALSE;

  if (!(ref_gather->recording)) return REF_SUCCESS;

  RSS(ref_gather_tec_histogram_frame(ref_grid, zone_title), "hist frame");

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");

  if (ref_grid_once(ref_grid)) {
    if (NULL == (void *)(ref_gather->grid_file)) {
      ref_gather->grid_file = fopen("ref_gather_movie.tec", "w");
      if (NULL == (void *)(ref_gather->grid_file))
        printf("unable to open ref_gather_movie.tec\n");
      RNS(ref_gather->grid_file, "unable to open file");

      fprintf(ref_gather->grid_file,
              "title=\"tecplot refine partition file\"\n");
      fprintf(ref_gather->grid_file,
              "variables = \"x\" \"y\" \"z\" \"n\" \"s\" \"l\" \"p\"\n");
    }
    if (NULL == zone_title) {
      fprintf(ref_gather->grid_file,
              "zone t=\"surf\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              nnode, ncell, "point", "fetriangle", ref_gather->time);
    } else {
      fprintf(ref_gather->grid_file,
              "zone t=\"%s\", nodes=" REF_GLOB_FMT
              ", elements=%ld, datapacking=%s, "
              "zonetype=%s, solutiontime=%f\n",
              zone_title, nnode, ncell, "point", "fetriangle",
              ref_gather->time);
    }
  }

  ref_malloc(scalar, ldim * ref_node_max(ref_node), REF_DBL);
  each_ref_node_valid_node(ref_node, node) {
    scalar[0 + ldim * node] = 2.0;
    scalar[1 + ldim * node] = 1.0;
    scalar[2 + ldim * node] = 1.0;
    scalar[3 + ldim * node] = (REF_DBL)ref_node_part(ref_node, node);
  }
  if (ref_geom_model_loaded(ref_geom) || ref_grid_twod(ref_grid)) {
    if (ref_geom_model_loaded(ref_geom) || ref_geom_meshlinked(ref_geom)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &dot), "norm dev");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], dot);
        }
      }
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        RSS(ref_node_tri_quality(ref_node, nodes, &quality), "tri qual");
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[0 + ldim * nodes[cell_node]] =
              MIN(scalar[0 + ldim * nodes[cell_node]], quality);
        }
      }
    }
    RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
      scalar[1 + ldim * node0] = MIN(scalar[1 + ldim * node0], edge_ratio);
      scalar[1 + ldim * node1] = MIN(scalar[1 + ldim * node1], edge_ratio);
      scalar[2 + ldim * node0] = MAX(scalar[2 + ldim * node0], edge_ratio);
      scalar[2 + ldim * node1] = MAX(scalar[2 + ldim * node1], edge_ratio);
    }
    RSS(ref_edge_free(ref_edge), "free edges");
  }

  if (metric_area && ref_grid_twod(ref_grid)) {
    REF_DBL area;
    REF_INT i, *hits;
    ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
    each_ref_node_valid_node(ref_node, node) { scalar[3 + ldim * node] = 0.0; }
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tri_metric_area(ref_node, nodes, &area), "tri area");
      for (i = 0; i < 3; i++) {
        scalar[3 + ldim * nodes[i]] += area;
        (hits[nodes[i]])++;
      }
    }
    each_ref_node_valid_node(ref_node, node) {
      if (hits[node] > 0) {
        scalar[3 + ldim * node] /= ((REF_DBL)hits[node]);
      }
    }
    ref_free(hits);
  }

  RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                               ref_gather->grid_file),
      "nodes");
  RSS(ref_gather_cell_tec(ref_node, ref_cell, ncell, l2c, REF_FALSE,
                          ref_gather->grid_file),
      "t");
  ref_free(l2c);

  if (ref_gather_low_quality_zone(ref_gather)) {
    RSS(ref_gather_cell_below_quality(ref_grid, ref_grid_tet(ref_grid),
                                      ref_gather->min_quality, &nnode, &ncell,
                                      &l2c),
        "cell below");

    if (node > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        if (NULL == zone_title) {
          fprintf(ref_gather->grid_file,
                  "zone t=\"qtet\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  nnode, ncell, "point", "fetetrahedron", ref_gather->time);
        } else {
          fprintf(ref_gather->grid_file,
                  "zone t=\"q%s\", nodes=" REF_GLOB_FMT
                  ", elements=%ld, datapacking=%s, "
                  "zonetype=%s, solutiontime=%f\n",
                  zone_title, nnode, ncell, "point", "fetetrahedron",
                  ref_gather->time);
        }
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar,
                                   ref_gather->grid_file),
          "nodes");
      RSS(ref_gather_cell_quality_tec(ref_node, ref_grid_tet(ref_grid), ncell,
                                      l2c, ref_gather->min_quality,
                                      ref_gather->grid_file),
          "qtet");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) {
    REIS(0, fflush(ref_gather->grid_file), "gather movie fflush");
    (ref_gather->time) += 1.0;
  }

  ref_free(scalar);

  return REF_SUCCESS;
}